

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

void ssl_calc_verify_tls_sha256(mbedtls_ssl_context *ssl,uchar *hash)

{
  undefined1 local_84 [8];
  mbedtls_sha256_context sha256;
  uchar *hash_local;
  mbedtls_ssl_context *ssl_local;
  
  sha256._100_8_ = hash;
  mbedtls_sha256_init((mbedtls_sha256_context *)local_84);
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0x416,"=> calc verify sha256");
  mbedtls_sha256_clone((mbedtls_sha256_context *)local_84,&ssl->handshake->fin_sha256);
  mbedtls_sha256_finish((mbedtls_sha256_context *)local_84,(uchar *)sha256._100_8_);
  mbedtls_debug_print_buf
            (ssl,3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0x41b,"calculated verify result",(uchar *)sha256._100_8_,0x20);
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0x41c,"<= calc verify");
  mbedtls_sha256_free((mbedtls_sha256_context *)local_84);
  return;
}

Assistant:

void ssl_calc_verify_tls_sha256( mbedtls_ssl_context *ssl, unsigned char hash[32] )
{
    mbedtls_sha256_context sha256;

    mbedtls_sha256_init( &sha256 );

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> calc verify sha256" ) );

    mbedtls_sha256_clone( &sha256, &ssl->handshake->fin_sha256 );
    mbedtls_sha256_finish( &sha256, hash );

    MBEDTLS_SSL_DEBUG_BUF( 3, "calculated verify result", hash, 32 );
    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= calc verify" ) );

    mbedtls_sha256_free( &sha256 );

    return;
}